

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall
TimerTest_syncrhonizedTimers_Test::TimerTest_syncrhonizedTimers_Test
          (TimerTest_syncrhonizedTimers_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a0950;
  return;
}

Assistant:

TEST(TimerTest, syncrhonizedTimers) {
	std::condition_variable notifier;
	std::mutex notifier_mutex;
	int timers_running = 0;

	// Spin up timer
	syncrhonized_timer timer_obj{period, [&notifier, &notifier_mutex, &timers_running](timer& in_timer) {
		std::unique_lock<std::mutex> lock(notifier_mutex);
		++timers_running;

		// Wait for a few more timer periods to pass before proceeding
		notifier.wait(lock);

		// We're done here; cancel
		--timers_running;
		notifier.notify_one();
		in_timer.cancel();
	}};

	// Wait for some timers to fire
	std::this_thread::sleep_for(period * 3);
	EXPECT_EQ(timers_running, 1);

	// Notify timers to close
	notifier.notify_all();

	// Wait for timers to complete
	std::unique_lock<std::mutex> lock(notifier_mutex);
	notifier.wait(lock, [&timers_running]() {
		return timers_running == 0;
	});
}